

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

void __thiscall Liby::Connection::sync_send(Connection *this,Buffer *buffer)

{
  Socket *this_00;
  bool bVar1;
  char *pcVar2;
  void *__buf;
  ulong uVar3;
  size_t in_RCX;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_40;
  undefined8 local_30;
  undefined8 uStack_28;
  
  Socket::setNoblock((this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,false);
  local_40._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:115:23)>
             ::_M_invoke;
  local_68._8_8_ = 0;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:115:23)>
             ::_M_manager;
  local_30 = 0;
  uStack_28 = 0;
  local_68._M_unused._M_object = this;
  local_40._M_unused._M_object = this;
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  while( true ) {
    bVar1 = Buffer::empty(buffer);
    if (bVar1) break;
    this_00 = (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar2 = Buffer::data(buffer);
    __buf = (void *)Buffer::size(buffer);
    uVar3 = Socket::write(this_00,(int)pcVar2,__buf,in_RCX);
    if ((int)uVar3 < 1) break;
    Buffer::retrieve(buffer,uVar3 & 0xffffffff);
  }
  DeferCaller::~DeferCaller((DeferCaller *)&local_68);
  return;
}

Assistant:

void Connection::sync_send(Buffer &buffer) {
    socket_->setNoblock(false);
    DeferCaller defer([this] { socket_->setNoblock(); });
    while (!buffer.empty()) {
        int nbytes =
            socket_->write(static_cast<void *>(buffer.data()), buffer.size());
        if (nbytes > 0) {
            buffer.retrieve(nbytes);
        } else {
            break;
        }
    }
}